

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O0

void vbyte_encode_u32(uint8_t **out,uint32_t x)

{
  byte *pbVar1;
  byte bVar2;
  uint in_ESI;
  long *in_RDI;
  
  if (in_ESI < 0x80) {
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = (byte)in_ESI & 0x7f;
  }
  else if (in_ESI < 0x4000) {
    bVar2 = extract7bits<0u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bitsmaskless<1u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 & 0x7f;
  }
  else if (in_ESI < 0x200000) {
    bVar2 = extract7bits<0u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<1u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bitsmaskless<2u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 & 0x7f;
  }
  else if (in_ESI < 0x10000000) {
    bVar2 = extract7bits<0u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<1u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<2u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bitsmaskless<3u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 & 0x7f;
  }
  else {
    bVar2 = extract7bits<0u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<1u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<2u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bits<3u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 | 0x80;
    bVar2 = extract7bitsmaskless<4u>(in_ESI);
    pbVar1 = (byte *)*in_RDI;
    *in_RDI = (long)(pbVar1 + 1);
    *pbVar1 = bVar2 & 0x7f;
  }
  return;
}

Assistant:

void vbyte_encode_u32(uint8_t*& out, uint32_t x)
{
    if (x < (1U << 7)) {
        *out++ = static_cast<uint8_t>(x & 127);
    } else if (x < (1U << 14)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bitsmaskless<1>(x) & 127;
    } else if (x < (1U << 21)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bitsmaskless<2>(x) & 127;
    } else if (x < (1U << 28)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bitsmaskless<3>(x) & 127;
    } else {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bits<3>(x) | 128;
        *out++ = extract7bitsmaskless<4>(x) & 127;
    }
}